

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void QUnifiedTimer::pauseAnimationTimer(QAbstractAnimationTimer *timer,int duration)

{
  byte bVar1;
  undefined4 in_ESI;
  long in_RDI;
  bool timerWasPaused;
  QUnifiedTimer *inst;
  parameter_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_fffffffffffffff0;
  
  instance();
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    startAnimationTimer((QAbstractAnimationTimer *)
                        CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  bVar1 = *(byte *)(in_RDI + 0x11);
  *(undefined1 *)(in_RDI + 0x11) = 1;
  *(undefined4 *)(in_RDI + 0x14) = in_ESI;
  if ((bVar1 & 1) == 0) {
    QList<QAbstractAnimationTimer_*>::operator<<
              ((QList<QAbstractAnimationTimer_*> *)
               (CONCAT17(bVar1,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
               in_stack_ffffffffffffffd8);
  }
  localRestart((QUnifiedTimer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void QUnifiedTimer::pauseAnimationTimer(QAbstractAnimationTimer *timer, int duration)
{
    QUnifiedTimer *inst = QUnifiedTimer::instance();
    if (!timer->isRegistered)
        inst->startAnimationTimer(timer);

    bool timerWasPaused = timer->isPaused;
    timer->isPaused = true;
    timer->pauseDuration = duration;
    if (!timerWasPaused)
        inst->pausedAnimationTimers << timer;
    inst->localRestart();
}